

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgba_5551_to_bgr_565
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort *puVar4;
  int iVar5;
  
  if (0 < height) {
    puVar3 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar4 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar5 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar3 + width;
        do {
          uVar2 = *puVar4;
          *puVar3 = uVar2 >> 0xb | uVar2 & 0x7c0 | (uVar2 & 0xfffe) << 10;
          puVar3 = puVar3 + 1;
          puVar4 = puVar4 + 1;
        } while (puVar3 < puVar1);
      }
      puVar4 = puVar4 + (src_pitch / 2 - width);
      puVar3 = puVar3 + (dst_pitch / 2 - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void rgba_5551_to_bgr_565(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_5551_TO_BGR_565(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}